

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void generateColumnNames(Parse *pParse,Select *pSelect)

{
  sqlite3 *db;
  Vdbe *pVVar1;
  ExprList *pEVar2;
  SrcList *pSVar3;
  ulong uVar4;
  Mem *pMVar5;
  Expr *pEVar6;
  Table *pTVar7;
  char *pcVar8;
  ushort uVar9;
  Select *pSVar10;
  code *xDel;
  char **ppcVar11;
  long lVar12;
  long lVar13;
  ExprList_item *pEVar14;
  NameContext local_68;
  
  if (pParse->explain != '\0') {
    return;
  }
  if (pParse->colNamesSet == '\0') {
    db = pParse->db;
    pVVar1 = pParse->pVdbe;
    do {
      pSVar10 = pSelect;
      pSelect = pSVar10->pPrior;
    } while (pSVar10->pPrior != (Select *)0x0);
    pEVar2 = pSVar10->pEList;
    pSVar3 = pSVar10->pSrc;
    pParse->colNamesSet = '\x01';
    uVar4 = db->flags;
    sqlite3VdbeSetNumCols(pVVar1,pEVar2->nExpr);
    if (0 < pEVar2->nExpr) {
      ppcVar11 = &pEVar2->a[0].zSpan;
      lVar13 = 0;
      lVar12 = 0;
      do {
        pcVar8 = ppcVar11[-1];
        if (pcVar8 == (char *)0x0) {
          if (((uVar4 & 0x44) == 0) ||
             (pEVar6 = ((ExprList_item *)(ppcVar11 + -2))->pExpr, pEVar6->op != 0xa2)) {
            if (*ppcVar11 == (char *)0x0) {
              pcVar8 = sqlite3MPrintf(db,"column%d",(ulong)((int)lVar12 + 1));
            }
            else {
              pcVar8 = sqlite3DbStrDup(db,*ppcVar11);
            }
          }
          else {
            uVar9 = pEVar6->iColumn;
            pTVar7 = (pEVar6->y).pTab;
            if ((short)uVar9 < 0) {
              uVar9 = pTVar7->iPKey;
            }
            pcVar8 = "rowid";
            if (-1 < (short)uVar9) {
              pcVar8 = pTVar7->aCol[uVar9].zName;
            }
            if ((uVar4 & 4) == 0) {
              if (pVVar1->db->mallocFailed == '\0') {
                pMVar5 = pVVar1->aColName;
                goto LAB_001a01fb;
              }
              goto LAB_001a02dc;
            }
            pcVar8 = sqlite3MPrintf(db,"%s.%s",pTVar7->zName);
          }
          if (pVVar1->db->mallocFailed == '\0') {
            pMVar5 = pVVar1->aColName;
            xDel = sqlite3MallocSize;
            goto LAB_001a02d7;
          }
        }
        else if (pVVar1->db->mallocFailed == '\0') {
          pMVar5 = pVVar1->aColName;
LAB_001a01fb:
          xDel = (_func_void_void_ptr *)0xffffffffffffffff;
LAB_001a02d7:
          sqlite3VdbeMemSetStr((Mem *)((long)&pMVar5->u + lVar13),pcVar8,-1,'\x01',xDel);
        }
LAB_001a02dc:
        lVar12 = lVar12 + 1;
        ppcVar11 = ppcVar11 + 4;
        lVar13 = lVar13 + 0x38;
      } while (lVar12 < pEVar2->nExpr);
    }
    pVVar1 = pParse->pVdbe;
    local_68.pNext = (NameContext *)0x0;
    if (0 < pEVar2->nExpr) {
      pEVar14 = pEVar2->a;
      lVar12 = 0;
      lVar13 = 0;
      local_68.pParse = pParse;
      local_68.pSrcList = pSVar3;
      do {
        pcVar8 = columnTypeImpl(&local_68,pEVar14->pExpr);
        if (pVVar1->db->mallocFailed == '\0') {
          sqlite3VdbeMemSetStr
                    ((Mem *)((long)&pVVar1->aColName[pVVar1->nResColumn].u + lVar12),pcVar8,-1,
                     '\x01',(_func_void_void_ptr *)0xffffffffffffffff);
        }
        lVar13 = lVar13 + 1;
        lVar12 = lVar12 + 0x38;
        pEVar14 = pEVar14 + 1;
      } while (lVar13 < pEVar2->nExpr);
    }
  }
  return;
}

Assistant:

static void generateColumnNames(
  Parse *pParse,      /* Parser context */
  Select *pSelect     /* Generate column names for this SELECT statement */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  Table *pTab;
  SrcList *pTabList;
  ExprList *pEList;
  sqlite3 *db = pParse->db;
  int fullName;    /* TABLE.COLUMN if no AS clause and is a direct table ref */
  int srcName;     /* COLUMN or TABLE.COLUMN if no AS clause and is direct */

#ifndef SQLITE_OMIT_EXPLAIN
  /* If this is an EXPLAIN, skip this step */
  if( pParse->explain ){
    return;
  }
#endif

  if( pParse->colNamesSet ) return;
  /* Column names are determined by the left-most term of a compound select */
  while( pSelect->pPrior ) pSelect = pSelect->pPrior;
  SELECTTRACE(1,pParse,pSelect,("generating column names\n"));
  pTabList = pSelect->pSrc;
  pEList = pSelect->pEList;
  assert( v!=0 );
  assert( pTabList!=0 );
  pParse->colNamesSet = 1;
  fullName = (db->flags & SQLITE_FullColNames)!=0;
  srcName = (db->flags & SQLITE_ShortColNames)!=0 || fullName;
  sqlite3VdbeSetNumCols(v, pEList->nExpr);
  for(i=0; i<pEList->nExpr; i++){
    Expr *p = pEList->a[i].pExpr;

    assert( p!=0 );
    assert( p->op!=TK_AGG_COLUMN );  /* Agg processing has not run yet */
    assert( p->op!=TK_COLUMN || p->y.pTab!=0 ); /* Covering idx not yet coded */
    if( pEList->a[i].zName ){
      /* An AS clause always takes first priority */
      char *zName = pEList->a[i].zName;
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_TRANSIENT);
    }else if( srcName && p->op==TK_COLUMN ){
      char *zCol;
      int iCol = p->iColumn;
      pTab = p->y.pTab;
      assert( pTab!=0 );
      if( iCol<0 ) iCol = pTab->iPKey;
      assert( iCol==-1 || (iCol>=0 && iCol<pTab->nCol) );
      if( iCol<0 ){
        zCol = "rowid";
      }else{
        zCol = pTab->aCol[iCol].zName;
      }
      if( fullName ){
        char *zName = 0;
        zName = sqlite3MPrintf(db, "%s.%s", pTab->zName, zCol);
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_DYNAMIC);
      }else{
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zCol, SQLITE_TRANSIENT);
      }
    }else{
      const char *z = pEList->a[i].zSpan;
      z = z==0 ? sqlite3MPrintf(db, "column%d", i+1) : sqlite3DbStrDup(db, z);
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, z, SQLITE_DYNAMIC);
    }
  }
  generateColumnTypes(pParse, pTabList, pEList);
}